

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

Oop __thiscall
Lodtalk::MethodCompiler::visitBlockExpression(MethodCompiler *this,BlockExpression *node)

{
  Assembler *this_00;
  FunctionalNode *this_01;
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  SequenceNode *pSVar5;
  Oop OVar6;
  Label *blockEnd;
  undefined4 extraout_var_00;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar7;
  LocalVariables *pLVar8;
  size_t sVar9;
  pointer psVar10;
  InstructionNode *pIVar11;
  InstructionNode *pIVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int arraySize;
  ulong uVar17;
  undefined4 extraout_var;
  
  iVar4 = (*(node->super_FunctionalNode).super_Node._vptr_Node[9])(node);
  if ((char)iVar4 == '\0') {
    this_01 = this->localContext;
    this->localContext = &node->super_FunctionalNode;
    this_00 = &this->gen;
    blockEnd = MethodAssembler::Assembler::makeLabel(this_00);
    iVar4 = (*(node->super_FunctionalNode).super_Node._vptr_Node[8])(node);
    arraySize = 0;
    if ((ArgumentList *)CONCAT44(extraout_var_00,iVar4) == (ArgumentList *)0x0) {
      uVar17 = 0;
    }
    else {
      pvVar7 = AST::ArgumentList::getArguments((ArgumentList *)CONCAT44(extraout_var_00,iVar4));
      uVar17 = (long)(pvVar7->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar7->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
    }
    pLVar8 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
    psVar10 = (pLVar8->
              super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(pLVar8->
                   super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar10;
    if (lVar13 != 0) {
      lVar13 = lVar13 >> 4;
      iVar4 = this->temporalVectorCount;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      arraySize = 0;
      do {
        peVar1 = (psVar10->
                 super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1->isCapturedInClosure_ == true) {
          peVar1->temporalVectorIndex = iVar4;
          peVar1->temporalIndex = arraySize;
          arraySize = arraySize + 1;
        }
        psVar10 = psVar10 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    iVar4 = this->temporalVectorCount;
    if ((iVar4 != 0) &&
       (sVar9 = AST::FunctionalNode::getArgumentCount(this_01), 0 < this->temporalVectorCount)) {
      iVar16 = 0;
      do {
        MethodAssembler::Assembler::pushTemporal(this_00,(int)sVar9 + iVar16);
        iVar16 = iVar16 + 1;
      } while (iVar16 < this->temporalVectorCount);
    }
    if (arraySize != 0) {
      this->temporalVectorCount = this->temporalVectorCount + 1;
      iVar4 = iVar4 + 1;
    }
    uVar15 = (ulong)(arraySize != 0);
    psVar10 = (pLVar8->
              super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(pLVar8->
                   super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar10;
    iVar16 = (int)uVar17;
    if (lVar13 != 0) {
      lVar13 = lVar13 >> 4;
      uVar14 = 0;
      do {
        peVar1 = (psVar10->
                 super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1->isCapturedInClosure_ == false) {
          if (uVar14 < uVar17) {
            peVar1->temporalIndex = (int)uVar14;
          }
          else {
            peVar1->temporalIndex = iVar16 + iVar4;
            uVar15 = uVar15 + 1;
            iVar4 = iVar4 + 1;
          }
        }
        uVar14 = uVar14 + 1;
        psVar10 = psVar10 + 1;
      } while (lVar13 + (ulong)(lVar13 == 0) != uVar14);
    }
    if (uVar15 != 0) {
      MethodAssembler::Assembler::pushNClosureTemps(this_00,(int)uVar15);
    }
    MethodAssembler::Assembler::pushClosure(this_00,iVar4,iVar16,blockEnd,0);
    if (arraySize != 0) {
      MethodAssembler::Assembler::pushNewArray(this_00,arraySize);
      MethodAssembler::Assembler::popStoreTemporal(this_00,iVar16 + this->temporalVectorCount + -1);
      if (uVar17 != 0) {
        lVar13 = 0;
        uVar15 = 0;
        do {
          psVar10 = (pLVar8->
                    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (*(char *)(*(long *)((long)&(psVar10->
                                         super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar13) + 0x19) == '\x01') {
            MethodAssembler::Assembler::pushTemporal(this_00,(int)uVar15);
            lVar2 = *(long *)((long)&(psVar10->
                                     super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar13);
            MethodAssembler::Assembler::popStoreTemporalInVector
                      (this_00,*(int *)(lVar2 + 8),*(int *)(lVar2 + 0xc));
          }
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x10;
        } while (uVar17 != uVar15);
      }
    }
    pIVar11 = MethodAssembler::Assembler::getLastInstruction(this_00);
    pSVar5 = AST::BlockExpression::getBody(node);
    (*(pSVar5->super_Node)._vptr_Node[2])(pSVar5,this);
    bVar3 = MethodAssembler::Assembler::isLastReturn(this_00);
    if (!bVar3) {
      pIVar12 = MethodAssembler::Assembler::getLastInstruction(this_00);
      if (pIVar12 == pIVar11) {
        MethodAssembler::Assembler::blockReturnNil(this_00);
      }
      else {
        MethodAssembler::Assembler::blockReturnTop(this_00);
      }
    }
    MethodAssembler::Assembler::putLabel(this_00,blockEnd);
    this->localContext = this_01;
    if (arraySize != 0) {
      this->temporalVectorCount = this->temporalVectorCount + -1;
    }
    return (Oop)&NilObject;
  }
  pSVar5 = AST::BlockExpression::getBody(node);
  OVar6.field_0._0_4_ = (*(pSVar5->super_Node)._vptr_Node[2])(pSVar5,this);
  OVar6.field_0.uintValue._4_4_ = extraout_var;
  return (Oop)OVar6.field_0;
}

Assistant:

Oop MethodCompiler::visitBlockExpression(BlockExpression *node)
{
    if(node->isInlined())
    {
        // Visit the method body
        return node->getBody()->acceptVisitor(this);
    }

    // Store the local context
    auto oldLocalContext = localContext;
    localContext = node;

    auto blockEnd = gen.makeLabel();

    // Process the arguments
    auto argumentList = node->getArgumentList();
    size_t argumentCount = 0;
    if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    auto capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(capturedCount++);
        }
    }

    // Push the captured temporal vectors.
    size_t numCopied = temporalVectorCount;
    size_t numLocals = 0;
    if(temporalVectorCount)
    {
        auto oldArgumentCount = oldLocalContext->getArgumentCount();
        for(auto i = 0; i < temporalVectorCount; ++i)
            gen.pushTemporal(int(oldArgumentCount + i));

    }

    if(capturedCount)
    {
        ++temporalVectorCount;

        // Reserve space for the inner temporal vector.
        ++numLocals;
        ++numCopied;
    }

    // Prepare the local variables of the block.
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
            continue;

        if(i < argumentCount)
        {
            localVar->setTemporalIndex((int)i);
        }
        else
        {
            localVar->setTemporalIndex(int(argumentCount + numCopied));
            ++numLocals;
            ++numCopied;
        }
    }

    // Reserve space for the locals.
    if(numLocals)
        gen.pushNClosureTemps((int)numLocals);

    // Push the block.
    gen.pushClosure((int)numCopied, (int)argumentCount, blockEnd, 0);

    // Generate the inner temporal vector.
    if(capturedCount)
    {
        gen.pushNewArray(capturedCount);
        gen.popStoreTemporal(int(argumentCount + temporalVectorCount - 1));

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), localVar->getTemporalVectorIndex());
            }
        }
    }

    auto closureBeginInstruction = gen.getLastInstruction();

    // Generate the block body.
    node->getBody()->acceptVisitor(this);

    // Always return
	if(!gen.isLastReturn())
    {
        if(gen.getLastInstruction() == closureBeginInstruction)
            gen.blockReturnNil();
        else
            gen.blockReturnTop();
    }

    // Finish the block.
    gen.putLabel(blockEnd);

    // Restore the local context
    localContext = oldLocalContext;

    if(capturedCount)
        --temporalVectorCount;

	return Oop();
}